

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  RDL_DimacsGraph *dimacs_graph_00;
  RDL_DimacsGraph *dimacs_graph;
  int return_code;
  int consistency_result;
  int basis_validation_result;
  int urf_validation_result;
  int timeout;
  uint idx;
  char *mode;
  RDL_data *data;
  RDL_graph *graph;
  char *filename;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  basis_validation_result = -1;
  filename = (char *)argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    fprintf(_stderr,
            "usage: %s mode filename [timeout=-1]\nwith mode \'demo\' for demo output of URF calculations\nor\nwith mode \'validate\' for testing/validation\n"
            ,*argv);
    return 1;
  }
  _timeout = argv[1];
  iVar1 = strcmp(_timeout,"demo");
  if (iVar1 == 0) {
    if ((int)argv_local < 3) {
      fprintf(_stderr,"usage: %s demo filename\n",*(undefined8 *)filename);
      return 1;
    }
  }
  else {
    iVar1 = strcmp(_timeout,"validate");
    if (iVar1 != 0) {
      fprintf(_stderr,"invalid mode \'%s\', allowed are \'demo\' and \'validate\'\n",_timeout);
      return 1;
    }
    if ((int)argv_local < 3) {
      fprintf(_stderr,
              "usage: %s demo filename [timeout=-1]\nwith timeout is validation timeout in seconds, default -1 (no timeout)\n"
              ,*(undefined8 *)filename);
      return 1;
    }
    if ((3 < (int)argv_local) &&
       (iVar1 = __isoc99_sscanf(*(undefined8 *)(filename + 0x18),"%d",&basis_validation_result),
       iVar1 == 0)) {
      fprintf(_stderr,"invalid timeout in seconds: \'%s\'\n",*(undefined8 *)(filename + 0x18));
      return 1;
    }
  }
  graph = *(RDL_graph **)(filename + 0x10);
  dimacs_graph_00 = RDL_dimacsGraph_read((char *)graph);
  if (dimacs_graph_00 == (RDL_DimacsGraph *)0x0) {
    fprintf(_stderr,"unable to read file \'%s\'\n",graph);
    argv_local._4_4_ = 1;
  }
  else {
    data = (RDL_data *)RDL_initNewGraph(dimacs_graph_00->nof_nodes);
    for (urf_validation_result = 0; (uint)urf_validation_result < dimacs_graph_00->nof_edges;
        urf_validation_result = urf_validation_result + 1) {
      RDL_addUEdge((RDL_graph *)data,dimacs_graph_00->edges[(uint)urf_validation_result][0] - 1,
                   dimacs_graph_00->edges[(uint)urf_validation_result][1] - 1);
    }
    RDL_setOutputFunction(RDL_writeToStderr);
    mode = (char *)RDL_calculate((RDL_graph *)data);
    if ((RDL_data *)mode == (RDL_data *)0x0) {
      fprintf(_stderr,"Calculation failed!\n");
      RDL_deleteGraph((RDL_graph *)data);
      RDL_dimacsGraph_delete(dimacs_graph_00);
      argv_local._4_4_ = 1;
    }
    else {
      iVar1 = strcmp(_timeout,"demo");
      if (iVar1 == 0) {
        RDL_demo_output((RDL_data *)mode);
        dimacs_graph._0_4_ = 0;
      }
      else {
        iVar1 = strcmp(_timeout,"validate");
        if (iVar1 == 0) {
          RDL_validate((RDL_data *)mode,dimacs_graph_00,basis_validation_result,&consistency_result,
                       &return_code);
          if (consistency_result == -1) {
            fprintf(_stdout,"URF validation timed out!\n");
          }
          else if (consistency_result == -2) {
            fprintf(_stdout,"URF validation ran out of memory!\n");
          }
          else if (consistency_result == 0) {
            fprintf(_stdout,"URF validation successful!\n");
          }
          else {
            fprintf(_stderr,"URF validation failed!\n");
          }
          if (return_code == -1) {
            fprintf(_stdout,"MCB validation timed out!\n");
          }
          else if (return_code == 0) {
            fprintf(_stdout,"MCB validation successful!\n");
          }
          else {
            fprintf(_stderr,"MCB validation failed!\n");
          }
          iVar1 = RDL_checkConsistency((RDL_data *)mode);
          if (iVar1 == 0) {
            fprintf(_stdout,"consistency validation successful!\n");
          }
          else {
            fprintf(_stderr,"consistency validation failed!\n");
          }
          if (((consistency_result == 0) && (iVar1 == 0)) && (return_code == 0)) {
            dimacs_graph._0_4_ = 0;
          }
          else {
            dimacs_graph._0_4_ = 1;
          }
        }
        else {
          dimacs_graph._0_4_ = 1;
        }
      }
      RDL_deleteData((RDL_data *)mode);
      RDL_dimacsGraph_delete(dimacs_graph_00);
      argv_local._4_4_ = (int)dimacs_graph;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
  const char* filename;
  RDL_graph *graph;
  RDL_data *data;
  const char* mode;
  unsigned idx;
  int timeout = -1, urf_validation_result, basis_validation_result, consistency_result;
  int return_code;

  if (argc < 2) {
    fprintf(stderr, "usage: %s mode filename [timeout=-1]\nwith mode 'demo' "
        "for demo output of URF calculations\n"
        "or\nwith mode 'validate' for testing/validation\n", argv[0]);
    return EXIT_FAILURE;
  }

  mode = argv[1];

  if (!strcmp(mode, "demo")) {
    if (argc < 3) {
      fprintf(stderr, "usage: %s demo filename\n", argv[0]);
      return EXIT_FAILURE;
    }
  }
  else if (!strcmp(mode, "validate")) {
    if (argc < 3) {
      fprintf(stderr, "usage: %s demo filename [timeout=-1]\n"
          "with timeout is validation timeout in seconds, default -1 (no timeout)\n", argv[0]);
      return EXIT_FAILURE;
    }
    if (argc > 3) {
      if (!sscanf(argv[3], "%d", &timeout)) {
        fprintf(stderr, "invalid timeout in seconds: '%s'\n", argv[3]);
        return EXIT_FAILURE;
      }
    }
  }
  else {
    fprintf(stderr, "invalid mode '%s', allowed are 'demo' and 'validate'\n", mode);
    return EXIT_FAILURE;
  }

  filename = argv[2];

  RDL_DimacsGraph* dimacs_graph = RDL_dimacsGraph_read(filename);

  if (!dimacs_graph) {
    fprintf(stderr, "unable to read file '%s'\n", filename);
    return EXIT_FAILURE;
  }

  graph = RDL_initNewGraph(dimacs_graph->nof_nodes);

  for (idx = 0; idx < dimacs_graph->nof_edges; ++idx) {
    RDL_addUEdge(graph, dimacs_graph->edges[idx][0]-1, dimacs_graph->edges[idx][1]-1);
  }

  RDL_setOutputFunction(RDL_writeToStderr);
  /* calculate Unique Ring Families */
  data = RDL_calculate(graph);
  if (!data) {
    fprintf(stderr, "Calculation failed!\n");
    RDL_deleteGraph(graph);
    RDL_dimacsGraph_delete(dimacs_graph);
    return EXIT_FAILURE;
  }

  if (!strcmp(mode, "demo")) {
    RDL_demo_output(data);
    return_code = EXIT_SUCCESS;
  }
  else if (!strcmp(mode, "validate")) {
    RDL_validate(data, dimacs_graph, timeout,
        &urf_validation_result, &basis_validation_result);
    if (urf_validation_result == -1) {
      fprintf(stdout, "URF validation timed out!\n");
    }
    else if (urf_validation_result == -2) {
      fprintf(stdout, "URF validation ran out of memory!\n");
    }
    else if (urf_validation_result == 0) {
      fprintf(stdout, "URF validation successful!\n");
    }
    else {
      fprintf(stderr, "URF validation failed!\n");
    }

    if (basis_validation_result == -1) {
      fprintf(stdout, "MCB validation timed out!\n");
    }
    else if (basis_validation_result == 0) {
      fprintf(stdout, "MCB validation successful!\n");
    }
    else {
      fprintf(stderr, "MCB validation failed!\n");
    }

    consistency_result = RDL_checkConsistency(data);
    if (consistency_result == 0) {
      fprintf(stdout, "consistency validation successful!\n");
    }
    else {
      fprintf(stderr, "consistency validation failed!\n");
    }

    if (urf_validation_result || consistency_result
        || basis_validation_result) {
      return_code = EXIT_FAILURE;
    }
    else {
      return_code = EXIT_SUCCESS;
    }
  }
  else {
    return_code = EXIT_FAILURE;
  }

  /* delete URFdata and the graph */
  RDL_deleteData(data);
  RDL_dimacsGraph_delete(dimacs_graph);

  return return_code;
}